

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestResultParser.cpp
# Opt level: O0

NumericValue xe::getNumericValue(string *value)

{
  long lVar1;
  char *pcVar2;
  deInt64 value_00;
  bool bVar3;
  double value_01;
  NumericValue NVar4;
  deInt64 num_1;
  double num;
  bool isFloat;
  string *value_local;
  anon_union_8_2_07d0b834_for_m_value local_10;
  
  lVar1 = std::__cxx11::string::find((char)value,0x2e);
  bVar3 = true;
  if (lVar1 == -1) {
    lVar1 = std::__cxx11::string::find((char)value,0x65);
    bVar3 = lVar1 != -1;
  }
  if (bVar3) {
    pcVar2 = (char *)std::__cxx11::string::c_str();
    pcVar2 = stripLeadingWhitespace(pcVar2);
    value_01 = toDouble(pcVar2);
    ri::NumericValue::NumericValue((NumericValue *)&value_local,value_01);
  }
  else {
    pcVar2 = (char *)std::__cxx11::string::c_str();
    pcVar2 = stripLeadingWhitespace(pcVar2);
    value_00 = toInt64(pcVar2);
    ri::NumericValue::NumericValue((NumericValue *)&value_local,value_00);
  }
  NVar4._4_4_ = 0;
  NVar4.m_type = (uint)value_local;
  NVar4.m_value.int64 = local_10.int64;
  return NVar4;
}

Assistant:

static ri::NumericValue getNumericValue (const std::string& value)
{
	const bool	isFloat		= value.find('.') != std::string::npos || value.find('e') != std::string::npos;

	if (isFloat)
	{
		const double num = toDouble(stripLeadingWhitespace(value.c_str()));
		return ri::NumericValue(num);
	}
	else
	{
		const deInt64 num = toInt64(stripLeadingWhitespace(value.c_str()));
		return ri::NumericValue(num);
	}
}